

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<int_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,double *rhs)

{
  lest *this_00;
  double *in_R8;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = *(lest **)this;
  __return_storage_ptr__->passed = (double)*(int *)this_00 == *rhs;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"==","");
  to_string<int,double>
            (&__return_storage_ptr__->decomposition,this_00,(int *)local_48,(string *)rhs,in_R8);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }